

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall nlohmann::json_schema::root_schema::set_root_schema(root_schema *this,json *sch)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  invalid_argument *piVar7;
  long *plVar8;
  size_type *psVar9;
  pointer pbVar10;
  _Base_ptr p_Var11;
  bool bVar12;
  key_type *__k;
  initializer_list<nlohmann::json_uri> __l;
  initializer_list<nlohmann::json_uri> __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  locations;
  json loaded_schema;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
  *__range3;
  string urefs;
  string local_1c8;
  _Rb_tree_node_base *local_1a0;
  undefined1 local_198 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [2];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
  *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_128;
  vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> local_110;
  undefined1 local_f8 [16];
  json_uri local_e8;
  
  local_150 = &this->files_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
  ::clear(&local_150->_M_t);
  local_198._0_8_ = (pointer)0x0;
  local_198._8_8_ = (pointer)0x0;
  local_198._16_8_ = (pointer)0x0;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"#","");
  json_uri::json_uri(&local_e8,&local_1c8);
  __l._M_len = 1;
  __l._M_array = &local_e8;
  std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
            (&local_128,__l,(allocator_type *)&local_148);
  anon_unknown.dwarf_41b1a::schema::make
            ((schema *)local_178,sch,this,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_198,&local_128);
  uVar2 = local_178[0]._8_8_;
  uVar1 = local_178[0]._M_allocated_capacity;
  local_178[0]._M_allocated_capacity = 0;
  local_178[0]._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->root_).
            super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)uVar1;
  (this->root_).super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
  if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178[0]._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178[0]._8_8_);
  }
  std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_128);
  json_uri::~json_uri(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_198);
  local_1a0 = &(this->files_)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    local_198._0_8_ = (key_type *)0x0;
    local_198._8_8_ = (key_type *)0x0;
    local_198._16_8_ = (pointer)0x0;
    p_Var4 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var4 == local_1a0) {
LAB_0012561c:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_198);
      break;
    }
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_198,(value_type *)(p_Var4 + 1));
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      uVar1 = local_198._8_8_;
    } while (p_Var4 != local_1a0);
    if (local_198._0_8_ == local_198._8_8_) goto LAB_0012561c;
    bVar12 = false;
    __k = (key_type *)local_198._0_8_;
    do {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_schema::root_schema::schema_file>_>_>
               ::operator[](local_150,__k);
      if ((pmVar5->schemas)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        if ((this->loader_).super__Function_base._M_manager == (_Manager_type)0x0) {
          piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::operator+(&local_1c8,"external schema reference \'",__k);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c8);
          local_e8.urn_._M_dataplus._M_p = (pointer)*plVar8;
          psVar9 = (size_type *)(plVar8 + 2);
          if ((size_type *)local_e8.urn_._M_dataplus._M_p == psVar9) {
            local_e8.urn_.field_2._M_allocated_capacity = *psVar9;
            local_e8.urn_.field_2._8_8_ = plVar8[3];
            local_e8.urn_._M_dataplus._M_p = (pointer)&local_e8.urn_.field_2;
          }
          else {
            local_e8.urn_.field_2._M_allocated_capacity = *psVar9;
          }
          local_e8.urn_._M_string_length = *(size_type *)(plVar8 + 1);
          *plVar8 = (long)psVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::invalid_argument::invalid_argument(piVar7,(string *)&local_e8);
          __cxa_throw(piVar7,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        local_178[0]._M_allocated_capacity = local_178[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
        local_178[0]._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        json_uri::json_uri(&local_e8,__k);
        if ((this->loader_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->loader_)._M_invoker)
                  ((_Any_data *)this,&local_e8,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_178);
        json_uri::~json_uri(&local_e8);
        local_1c8._M_dataplus._M_p = (pointer)0x0;
        local_1c8._M_string_length = 0;
        local_1c8.field_2._M_allocated_capacity = 0;
        json_uri::json_uri(&local_e8,__k);
        __l_00._M_len = 1;
        __l_00._M_array = &local_e8;
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::vector
                  (&local_110,__l_00,(allocator_type *)&local_148);
        anon_unknown.dwarf_41b1a::schema::make
                  ((schema *)local_f8,(json *)local_178,this,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_1c8,&local_110);
        if ((root_schema *)local_f8._8_8_ != (root_schema *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
        }
        std::vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_>::~vector(&local_110);
        json_uri::~json_uri(&local_e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1c8);
        json_abi_v3_11_2::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_178);
        bVar12 = true;
      }
      __k = __k + 1;
    } while (__k != (key_type *)uVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_198);
  } while (bVar12);
  p_Var4 = (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var4 != local_1a0) {
    do {
      p_Var11 = p_Var4[4]._M_right;
      if (p_Var11 != (_Base_ptr)0x0) {
        local_e8.urn_._M_dataplus._M_p = (pointer)&local_e8.urn_.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"[","");
        p_Var6 = p_Var4[4]._M_parent;
        if (p_Var6 != (_Base_ptr)&p_Var4[3]._M_right) {
          do {
            p_Var11 = (_Base_ptr)((long)&p_Var11[-1]._M_right + 7);
            std::__cxx11::string::_M_append((char *)&local_e8,*(ulong *)(p_Var6 + 1));
            if (p_Var11 != (_Base_ptr)0x0) {
              std::__cxx11::string::append((char *)&local_e8);
            }
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
          } while (p_Var6 != (_Base_ptr)&p_Var4[3]._M_right);
        }
        std::__cxx11::string::append((char *)&local_e8);
        piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
        iVar3 = std::__cxx11::string::compare((char *)(p_Var4 + 1));
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        if (iVar3 == 0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"<root>","");
        }
        else {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,*(long *)(p_Var4 + 1),
                     (long)&(p_Var4[1]._M_parent)->_M_color + *(long *)(p_Var4 + 1));
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178,"after all files have been parsed, \'",&local_148);
        plVar8 = (long *)std::__cxx11::string::append(local_178[0]._M_local_buf);
        local_198._0_8_ = *plVar8;
        pbVar10 = (pointer)(plVar8 + 2);
        if ((pointer)local_198._0_8_ == pbVar10) {
          local_198._16_8_ = (pbVar10->_M_dataplus)._M_p;
          local_198._24_8_ = plVar8[3];
          local_198._0_8_ = (pointer)(local_198 + 0x10);
        }
        else {
          local_198._16_8_ = (pbVar10->_M_dataplus)._M_p;
        }
        local_198._8_8_ = plVar8[1];
        *plVar8 = (long)pbVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::operator+(&local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,&local_e8.urn_);
        std::invalid_argument::invalid_argument(piVar7,(string *)&local_1c8);
        __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_1a0);
  }
  return;
}

Assistant:

void set_root_schema(json sch)
	{
		files_.clear();
		root_ = schema::make(sch, this, {}, {{"#"}});

		// load all files which have not yet been loaded
		do {
			bool new_schema_loaded = false;

			// files_ is modified during parsing, iterators are invalidated
			std::vector<std::string> locations;
			for (auto &file : files_)
				locations.push_back(file.first);

			for (auto &loc : locations) {
				if (files_[loc].schemas.size() == 0) { // nothing has been loaded for this file
					if (loader_) {
						json loaded_schema;

						loader_(loc, loaded_schema);

						schema::make(loaded_schema, this, {}, {{loc}});
						new_schema_loaded = true;
					} else {
						throw std::invalid_argument("external schema reference '" + loc + "' needs loading, but no loader callback given");
					}
				}
			}

			if (!new_schema_loaded) // if no new schema loaded, no need to try again
				break;
		} while (1);

		for (const auto &file : files_) {
			if (file.second.unresolved.size() != 0) {
				// Build a representation of the undefined
				// references as a list of comma-separated strings.
				auto n_urefs = file.second.unresolved.size();
				std::string urefs = "[";

				decltype(n_urefs) counter = 0;
				for (const auto &p : file.second.unresolved) {
					urefs += p.first;

					if (counter != n_urefs - 1u) {
						urefs += ", ";
					}

					++counter;
				}

				urefs += "]";

				throw std::invalid_argument("after all files have been parsed, '" +
				                            (file.first == "" ? "<root>" : file.first) +
				                            "' has still the following undefined references: " + urefs);
			}
		}
	}